

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_draw_list_path_last(nk_draw_list *list)

{
  void *pvVar1;
  nk_vec2 *point;
  void *memory;
  nk_draw_list *list_local;
  
  if (list->path_count != 0) {
    pvVar1 = nk_buffer_memory(list->buffer);
    return *(nk_vec2 *)((long)pvVar1 + (ulong)(list->path_count - 1) * 8 + (ulong)list->path_offset)
    ;
  }
  __assert_fail("list->path_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x241f,"struct nk_vec2 nk_draw_list_path_last(struct nk_draw_list *)");
}

Assistant:

NK_INTERN struct nk_vec2
nk_draw_list_path_last(struct nk_draw_list *list)
{
    void *memory;
    struct nk_vec2 *point;
    NK_ASSERT(list->path_count);
    memory = nk_buffer_memory(list->buffer);
    point = nk_ptr_add(struct nk_vec2, memory, list->path_offset);
    point += (list->path_count-1);
    return *point;
}